

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O0

unsigned_long bhf::StringTo<unsigned_long>(string *v,unsigned_long value)

{
  long lVar1;
  ostream *poVar2;
  _func_ios_base_ptr_ios_base_ptr *local_1c8;
  stringstream local_1a8 [8];
  stringstream converter;
  ostream aoStack_198 [383];
  byte local_19;
  unsigned_long uStack_18;
  bool asHex;
  unsigned_long value_local;
  string *v_local;
  
  uStack_18 = value;
  value_local = (unsigned_long)v;
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    lVar1 = std::__cxx11::string::rfind((char *)value_local,0x120451);
    local_19 = lVar1 != -1;
    std::__cxx11::stringstream::stringstream(local_1a8);
    if ((local_19 & 1) == 0) {
      local_1c8 = std::dec;
    }
    else {
      local_1c8 = std::hex;
    }
    poVar2 = (ostream *)std::ostream::operator<<(aoStack_198,local_1c8);
    std::operator<<(poVar2,(string *)value_local);
    std::istream::operator>>((istream *)local_1a8,&stack0xffffffffffffffe8);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return uStack_18;
}

Assistant:

T StringTo(const std::string& v, T value = {})
{
    if (v.size()) {
        const auto asHex = (v.npos != v.rfind("0x", 0));
        std::stringstream converter;
        converter << (asHex ? std::hex : std::dec) << v;
        converter >> value;
    }
    return value;
}